

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O2

void __thiscall
tchecker::details::statement_typechecker_t::statement_typechecker_t
          (statement_typechecker_t *this,integer_variables_t *localvars,integer_variables_t *intvars
          ,clock_variables_t *clocks,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *error)

{
  (this->super_statement_visitor_t)._vptr_statement_visitor_t =
       (_func_int **)&PTR__statement_typechecker_t_0022a4d0;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::array_variables_t(&(this->_localvars).
                       super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&localvars->
                        super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
  this->_intvars = intvars;
  this->_clocks = clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->_error,error);
  return;
}

Assistant:

statement_typechecker_t(tchecker::integer_variables_t const & localvars, tchecker::integer_variables_t const & intvars,
                          tchecker::clock_variables_t const & clocks, std::function<void(std::string const &)> error)
      : _typed_stmt(nullptr), _localvars(localvars), _intvars(intvars), _clocks(clocks), _error(error)
  {
  }